

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O1

spv_result_t spvtools::val::ConstantPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  bool bVar2;
  int32_t iVar3;
  Op opcode;
  _Head_base<2UL,_unsigned_int,_false> _Var4;
  uint uVar5;
  uint uVar6;
  uint id;
  long *plVar7;
  ulong uVar8;
  DiagnosticStream *pDVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  ulong uVar12;
  Instruction *pIVar13;
  byte bVar14;
  size_type *psVar15;
  long lVar16;
  size_t sVar17;
  char *pcVar18;
  spv_result_t sVar19;
  spv_result_t sVar20;
  bool bVar21;
  string opcode_name;
  string local_290;
  string local_270;
  Instruction *local_250;
  string local_248;
  Instruction *local_228;
  uint local_21c;
  Instruction *local_218;
  Instruction *local_210;
  undefined1 local_208 [5];
  char cStack_203;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined1 uStack_1f6;
  undefined5 uStack_1f5;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x29:
  case 0x2a:
  case 0x30:
  case 0x31:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 == (Instruction *)0x0) || (sVar19 = SPV_SUCCESS, (pIVar10->inst_).opcode != 0x14))
    {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Op",2);
      local_290._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
      pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_290);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar9," Result Type <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar9,local_270._M_dataplus._M_p,local_270._M_string_length);
      pcVar18 = " is not a boolean type.";
LAB_0066402e:
      lVar16 = 0x17;
      goto LAB_00664033;
    }
    break;
  default:
    goto switchD_00663f85_caseD_2b;
  case 0x2c:
  case 0x33:
    local_1f8 = 0x704f;
    local_200 = 2;
    uStack_1f6 = 0;
    _local_208 = (_Tuple_impl<1UL,_bool,_unsigned_int>)&local_1f8;
    spvOpcodeString((uint)uVar1);
    plVar7 = (long *)std::__cxx11::string::append(local_208);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    psVar15 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_270.field_2._M_allocated_capacity = *psVar15;
      local_270.field_2._8_8_ = plVar7[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar15;
      local_270._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_270._M_string_length = plVar7[1];
    *plVar7 = (long)psVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (_local_208 != (_Tuple_impl<1UL,_bool,_unsigned_int>)&local_1f8) {
      operator_delete((void *)_local_208,CONCAT53(uStack_1f5,CONCAT12(uStack_1f6,local_1f8)) + 1);
    }
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 == (Instruction *)0x0) ||
       (iVar3 = spvOpcodeIsComposite((uint)(pIVar10->inst_).opcode), iVar3 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," Result Type <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
      pcVar18 = " is not a composite type.";
      lVar16 = 0x19;
LAB_0066498b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
      sVar19 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      goto LAB_006655a7;
    }
    lVar16 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar8 = lVar16 - 3;
    uVar1 = (pIVar10->inst_).opcode;
    if (0x1167 < uVar1) {
      if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) {
        if (uVar8 != 1) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          pcVar18 = " count must be one.";
          lVar16 = 0x13;
          goto LAB_0066498b;
        }
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar13 == (Instruction *)0x0) ||
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar13->inst_).opcode), !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," is not a constant or undef.",0x1c);
          sVar19 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pIVar11 = ValidationState_t::FindDef(_,(pIVar13->inst_).type_id);
          if (pIVar11 != (Instruction *)0x0) {
            uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
            pIVar13 = ValidationState_t::FindDef(_,uVar6);
            if ((pIVar13 != (Instruction *)0x0) &&
               ((pIVar13->inst_).result_id == (pIVar11->inst_).result_id)) {
              bVar2 = true;
              goto LAB_00665989;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," type does not match the Result Type <id> ",0x2a);
            ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(pIVar10->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"s component type.",0x11);
            pIVar11 = (Instruction *)(ulong)(uint)local_38;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) goto LAB_0066549c;
            goto LAB_00665982;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Result type is not defined.",0x1b);
          sVar19 = local_38;
        }
        pIVar11 = (Instruction *)(ulong)(uint)sVar19;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar2 = false;
        goto LAB_00665989;
      }
      if (uVar1 == 0x14a8) goto switchD_0066443e_caseD_17;
      goto switchD_0066443e_caseD_19;
    }
    switch(uVar1) {
    case 0x17:
switchD_0066443e_caseD_17:
      _Var4._M_head_impl = ValidationState_t::GetDimension(_,(pIVar10->inst_).result_id);
      if ((pIVar10->inst_).opcode == 0x14a8) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
        ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar5);
        bVar14 = local_208[4] ^ 1;
        _Var4._M_head_impl = local_208._0_4_;
      }
      else {
        bVar14 = 0;
      }
      if ((bVar14 == 0) && (uVar8 != _Var4._M_head_impl)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> count does not match Result Type <id> ",
                   0x38);
        ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        pcVar18 = "s vector component count.";
        lVar16 = 0x19;
LAB_00664f83:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
        sVar19 = local_38;
LAB_006653ef:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00665594;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      local_228 = ValidationState_t::FindDef(_,uVar5);
      if (local_228 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Component type is not defined.";
        lVar16 = 0x1e;
        goto LAB_00665582;
      }
      bVar2 = (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21;
      if (!bVar2) {
        sVar17 = 2;
        local_250 = pIVar10;
        do {
          uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar17);
          pIVar10 = ValidationState_t::FindDef(_,uVar5);
          if ((pIVar10 == (Instruction *)0x0) ||
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is not a constant or undef.",0x1c);
            uVar8 = (ulong)(uint)local_38;
LAB_00665199:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar2 = false;
          }
          else {
            pIVar13 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
            pIVar10 = local_250;
            if ((pIVar13 == (Instruction *)0x0) ||
               (bVar2 = true, (local_228->inst_).result_id != (pIVar13->inst_).result_id)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," Constituent <id> ",0x12);
              ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"s type does not match Result Type <id> ",0x27);
              ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(pIVar10->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"s vector element type.",0x16);
              uVar8 = (ulong)(uint)local_38;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00665199;
            }
          }
          if (!bVar2) goto LAB_00665599;
          sVar17 = sVar17 + 1;
          bVar21 = sVar17 < (ulong)((long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
          bVar2 = !bVar21;
        } while (bVar21);
      }
      break;
    case 0x18:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
      if (uVar8 == uVar5) {
        pIVar11 = ValidationState_t::FindDef
                            (_,(pIVar10->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[2]);
        if (pIVar11 == (Instruction *)0x0) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
          pcVar18 = "Column type is not defined.";
          lVar16 = 0x1b;
        }
        else {
          local_21c = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
          uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
          local_218 = ValidationState_t::FindDef(_,uVar5);
          if (local_218 != (Instruction *)0x0) {
            bVar2 = (ulong)((long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start) < 0x21;
            local_250 = pIVar10;
            local_210 = pIVar11;
            if (!bVar2) {
              pIVar13 = (Instruction *)0x2;
              do {
                local_228 = pIVar13;
                uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,(size_t)pIVar13);
                pIVar10 = ValidationState_t::FindDef(_,uVar5);
                if ((pIVar10 == (Instruction *)0x0) ||
                   (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_270._M_dataplus._M_p,
                             local_270._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," Constituent <id> ",0x12);
                  ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_290._M_dataplus._M_p,
                             local_290._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," is not a constant or undef.",0x1c);
                  pIVar11 = (Instruction *)(ulong)(uint)local_38;
LAB_006646d6:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290._M_dataplus._M_p != &local_290.field_2) {
LAB_006646e5:
                    operator_delete(local_290._M_dataplus._M_p,
                                    local_290.field_2._M_allocated_capacity + 1);
                  }
LAB_006646f2:
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  bVar2 = false;
                }
                else {
                  pIVar13 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
                  if (pIVar13 != (Instruction *)0x0) {
                    if ((local_210->inst_).opcode == (pIVar13->inst_).opcode) {
                      uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
                      pIVar10 = ValidationState_t::FindDef(_,uVar6);
                      if ((local_218->inst_).result_id == (pIVar10->inst_).result_id) {
                        bVar2 = true;
                        if (local_21c !=
                            (pIVar13->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[3]) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,local_270._M_dataplus._M_p,
                                     local_270._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208," Constituent <id> ",0x12);
                          ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,local_290._M_dataplus._M_p,
                                     local_290._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,
                                     " vector component count does not match Result Type <id> ",0x38
                                    );
                          ValidationState_t::getIdName_abi_cxx11_
                                    (&local_248,_,(local_250->inst_).result_id);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,local_248._M_dataplus._M_p,
                                     local_248._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,"s vector component count.",0x19);
                          pIVar11 = (Instruction *)(ulong)(uint)local_38;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_248._M_dataplus._M_p != &local_248.field_2) {
                            operator_delete(local_248._M_dataplus._M_p,
                                            local_248.field_2._M_allocated_capacity + 1);
                          }
                          goto LAB_006646d6;
                        }
                        goto LAB_00664701;
                      }
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_270._M_dataplus._M_p,
                                 local_270._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208," Constituent <id> ",0x12);
                      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_290._M_dataplus._M_p,
                                 local_290._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,
                                 " component type does not match Result Type <id> ",0x30);
                      ValidationState_t::getIdName_abi_cxx11_
                                (&local_248,_,(local_250->inst_).result_id);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_248._M_dataplus._M_p,
                                 local_248._M_string_length);
                      lVar16 = 0x1f;
                      pcVar18 = "s matrix column component type.";
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_270._M_dataplus._M_p,
                                 local_270._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208," Constituent <id> ",0x12);
                      ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_290._M_dataplus._M_p,
                                 local_290._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208," type does not match Result Type <id> ",0x26)
                      ;
                      ValidationState_t::getIdName_abi_cxx11_
                                (&local_248,_,(local_250->inst_).result_id);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_248._M_dataplus._M_p,
                                 local_248._M_string_length);
                      lVar16 = 0x15;
                      pcVar18 = "s matrix column type.";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,pcVar18,lVar16);
                    pIVar11 = (Instruction *)(ulong)(uint)local_38;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                      operator_delete(local_248._M_dataplus._M_p,
                                      local_248.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290._M_dataplus._M_p != &local_290.field_2) goto LAB_006646e5;
                    goto LAB_006646f2;
                  }
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Result type is not defined.",0x1b);
                  pIVar11 = (Instruction *)(ulong)(uint)local_38;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  bVar2 = false;
                }
LAB_00664701:
                if (!bVar2) goto LAB_00665987;
                pIVar13 = (Instruction *)
                          ((long)&(local_228->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
                bVar21 = pIVar13 < (Instruction *)
                                   ((long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
                bVar2 = !bVar21;
              } while (bVar21);
            }
            goto LAB_00665989;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
          pcVar18 = "Component type is not defined.";
          lVar16 = 0x1e;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
        pIVar11 = (Instruction *)(ulong)(uint)local_38;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> count does not match Result Type <id> ",
                   0x38);
        ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"s matrix column count.",0x16);
        pIVar11 = (Instruction *)(ulong)(uint)local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
LAB_0066549c:
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00665982:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_00665987:
      bVar2 = false;
LAB_00665989:
      sVar19 = (spv_result_t)pIVar11;
      if (!bVar2) goto LAB_006655a7;
    default:
      goto switchD_0066443e_caseD_19;
    case 0x1c:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      pIVar13 = ValidationState_t::FindDef(_,uVar5);
      if (pIVar13 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Element type is not defined.";
        lVar16 = 0x1c;
      }
      else {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar5);
        if (pIVar11 != (Instruction *)0x0) {
          ValidationState_t::EvalInt32IfConst
                    ((tuple<bool,_bool,_unsigned_int> *)local_208,_,(pIVar11->inst_).result_id);
          if (((cStack_203 != '\x01') || (local_208[4] == false)) ||
             (uVar8 == ((ulong)_local_208 & 0xffffffff))) {
            bVar2 = (ulong)((long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start) < 0x21;
            local_228 = pIVar13;
            if (!bVar2) {
              sVar17 = 2;
              local_250 = pIVar10;
              do {
                uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar17);
                pIVar10 = ValidationState_t::FindDef(_,uVar5);
                if ((pIVar10 == (Instruction *)0x0) ||
                   (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_270._M_dataplus._M_p,
                             local_270._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," Constituent <id> ",0x12);
                  ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_290._M_dataplus._M_p,
                             local_290._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," is not a constant or undef.",0x1c);
                  uVar8 = (ulong)(uint)local_38;
LAB_006657a0:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290._M_dataplus._M_p != &local_290.field_2) {
                    operator_delete(local_290._M_dataplus._M_p,
                                    local_290.field_2._M_allocated_capacity + 1);
                  }
LAB_006657c4:
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                  bVar2 = false;
                }
                else {
                  pIVar11 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
                  pIVar13 = local_250;
                  if (pIVar11 == (Instruction *)0x0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"Result type is not defined.",0x1b);
                    uVar8 = (ulong)(uint)local_38;
                    goto LAB_006657c4;
                  }
                  bVar2 = true;
                  if ((local_228->inst_).result_id != (pIVar11->inst_).result_id) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_270._M_dataplus._M_p,
                               local_270._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208," Constituent <id> ",0x12);
                    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_290._M_dataplus._M_p,
                               local_290._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"s type does not match Result Type <id> ",0x27);
                    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(pIVar13->inst_).result_id)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_248._M_dataplus._M_p,
                               local_248._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"s array element type.",0x15);
                    uVar8 = (ulong)(uint)local_38;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_248._M_dataplus._M_p != &local_248.field_2) {
                      operator_delete(local_248._M_dataplus._M_p,
                                      local_248.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_006657a0;
                  }
                }
                if (!bVar2) goto LAB_00665599;
                sVar17 = sVar17 + 1;
                bVar21 = sVar17 < (ulong)((long)(inst->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(inst->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4);
                bVar2 = !bVar21;
              } while (bVar21);
            }
            break;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent count does not match Result Type <id> ",0x33
                    );
          ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(pIVar10->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          pcVar18 = "s array length.";
          lVar16 = 0xf;
          goto LAB_00664f83;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Length is not defined.";
        lVar16 = 0x16;
      }
LAB_00665582:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
      sVar19 = local_38;
LAB_00665594:
      uVar8 = (ulong)(uint)sVar19;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_00665599:
      bVar2 = false;
      break;
    case 0x1e:
      if ((long)(pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2 != lVar16 + -1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> ",0x12);
        ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," count does not match Result Type <id> ",0x27);
        ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"s struct member count.",0x16);
        sVar19 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        goto LAB_006653ef;
      }
      bVar2 = (ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21;
      local_250 = pIVar10;
      if (!bVar2) {
        sVar17 = 2;
        uVar5 = 3;
        do {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,sVar17);
          pIVar10 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar10 == (Instruction *)0x0) ||
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is not a constant or undef.",0x1c);
            uVar8 = (ulong)(uint)local_38;
LAB_00664e6b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
LAB_00664e8f:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar2 = false;
          }
          else {
            pIVar13 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
            if (pIVar13 == (Instruction *)0x0) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Result type is not defined.",0x1b);
              uVar8 = (ulong)(uint)local_38;
              goto LAB_00664e8f;
            }
            id = Instruction::GetOperandAs<unsigned_int>(local_250,(ulong)(uVar5 - 2));
            pIVar10 = ValidationState_t::FindDef(_,id);
            if ((pIVar10 == (Instruction *)0x0) ||
               (bVar2 = true, (pIVar10->inst_).result_id != (pIVar13->inst_).result_id)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," Constituent <id> ",0x12);
              ValidationState_t::getIdName_abi_cxx11_(&local_290,_,uVar6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," type does not match the Result Type <id> ",0x2a);
              ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(local_250->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"s member type.",0xe);
              uVar8 = (ulong)(uint)local_38;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00664e6b;
            }
          }
          if (!bVar2) goto LAB_00665599;
          sVar17 = (size_t)uVar5;
          uVar12 = (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar5 = uVar5 + 1;
          bVar2 = uVar12 <= sVar17;
        } while (sVar17 < uVar12);
      }
    }
    sVar19 = (spv_result_t)uVar8;
    if (bVar2) {
switchD_0066443e_caseD_19:
      sVar19 = SPV_SUCCESS;
    }
LAB_006655a7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x2d:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 == (Instruction *)0x0) || (sVar19 = SPV_SUCCESS, (pIVar10->inst_).opcode != 0x1a))
    {
      pDVar9 = (DiagnosticStream *)local_208;
      ValidationState_t::diag(pDVar9,_,SPV_ERROR_INVALID_ID,pIVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar9,"OpConstantSampler Result Type <id> ",0x23);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar9,local_270._M_dataplus._M_p,local_270._M_string_length);
      pcVar18 = " is not a sampler type.";
      goto LAB_0066402e;
    }
    break;
  case 0x2e:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar10 != (Instruction *)0x0) {
      bVar2 = anon_unknown_1::IsTypeNullable(&pIVar10->words_,_);
      sVar19 = SPV_SUCCESS;
      if (bVar2) break;
    }
    pDVar9 = (DiagnosticStream *)local_208;
    ValidationState_t::diag(pDVar9,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,"OpConstantNull Result Type <id> ",0x20);
    ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_270._M_dataplus._M_p,local_270._M_string_length);
    pcVar18 = " cannot have a null value.";
    lVar16 = 0x1a;
LAB_00664033:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9,pcVar18,lVar16);
    sVar19 = pDVar9->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
LAB_00664065:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    break;
  case 0x32:
    sVar19 = SPV_SUCCESS;
    uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,uVar5);
    if ((pIVar10->inst_).opcode - 0x17 < 0xfffffffe) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar18 = "Specialization constant must be an integer or floating-point number.";
      lVar16 = 0x44;
LAB_00664389:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar16);
      sVar19 = local_38;
      goto LAB_00664065;
    }
    break;
  case 0x34:
    opcode = Instruction::GetOperandAs<spv::Op>(inst,2);
    sVar20 = SPV_SUCCESS;
    uVar8 = (ulong)(opcode - OpAccessChain);
    sVar19 = SPV_SUCCESS;
    if (opcode - OpAccessChain < 0x3f) {
      if ((0x4b90f00000000027U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_00664a53;
      if (uVar8 == 0x30) {
        sVar19 = sVar20;
        if (((_->features_).uconvert_spec_constant_op == false) &&
           (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
           !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = 
          "Prior to SPIR-V 1.4, specialization constant operation UConvert requires Kernel capability or extension SPV_AMD_gpu_shader_int16"
          ;
          lVar16 = 0x80;
          goto LAB_00664389;
        }
      }
      else {
        if (uVar8 != 0x33) goto LAB_00664a35;
        bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (!bVar2) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Specialization constant operation ",0x22);
          local_270._M_dataplus._M_p = spvOpcodeString(OpQuantizeToF16);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar9," requires Shader capability",0x1b);
          sVar19 = pDVar9->error_;
          goto LAB_00664065;
        }
      }
    }
    else {
LAB_00664a35:
      if ((opcode - OpFAdd < 0xd) &&
         (sVar19 = sVar20, (0x1895U >> (opcode - OpFAdd & 0x1f) & 1) != 0)) {
LAB_00664a53:
        bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
        sVar19 = sVar20;
        if (!bVar2) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Specialization constant operation ",0x22);
          local_270._M_dataplus._M_p = spvOpcodeString(opcode);
          pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar9," requires Kernel capability",0x1b);
          sVar19 = pDVar9->error_;
          goto LAB_00664065;
        }
      }
    }
  }
  if (sVar19 == SPV_SUCCESS) {
switchD_00663f85_caseD_2b:
    iVar3 = spvOpcodeIsConstant((uint)(inst->inst_).opcode);
    sVar19 = SPV_SUCCESS;
    if ((((iVar3 != 0) &&
         (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader),
         bVar2)) &&
        (bVar2 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id), sVar19 = SPV_SUCCESS,
        !bVar2)) &&
       (bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id), bVar2)
       ) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Cannot form constants of 8- or 16-bit types",0x2b);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      sVar19 = local_38;
    }
  }
  return sVar19;
}

Assistant:

spv_result_t ConstantPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpConstantTrue:
    case spv::Op::OpConstantFalse:
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
      if (auto error = ValidateConstantBool(_, inst)) return error;
      break;
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      if (auto error = ValidateConstantComposite(_, inst)) return error;
      break;
    case spv::Op::OpConstantSampler:
      if (auto error = ValidateConstantSampler(_, inst)) return error;
      break;
    case spv::Op::OpConstantNull:
      if (auto error = ValidateConstantNull(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstant:
      if (auto error = ValidateSpecConstant(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstantOp:
      if (auto error = ValidateSpecConstantOp(_, inst)) return error;
      break;
    default:
      break;
  }

  // Generally disallow creating 8- or 16-bit constants unless the full
  // capabilities are present.
  if (spvOpcodeIsConstant(inst->opcode()) &&
      _.HasCapability(spv::Capability::Shader) &&
      !_.IsPointerType(inst->type_id()) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot form constants of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}